

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
 __thiscall
(anonymous_namespace)::
BuildHighbdLumaParams<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,ConvolveParams*,int)>
          (_anonymous_namespace_ *this,
          _func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
          *test_func)

{
  int iVar1;
  BlockSize BVar2;
  int iVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  pointer pTVar6;
  ulong uVar7;
  pointer __src;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr extraout_RAX;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  pointer pTVar12;
  _Link_type __x;
  _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  *p_Var13;
  pointer pTVar14;
  int b;
  long lVar15;
  pointer pTVar16;
  ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
  PVar17;
  set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
  sizes;
  undefined1 local_80 [40];
  _Rb_tree_node_base local_58;
  undefined8 local_38;
  
  local_80._24_8_ = (_Base_ptr)0xc0000000a;
  local_58._M_left = &local_58;
  local_58._M_color = _S_red;
  lVar15 = 0;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  local_80._8_8_ = this;
  local_58._M_right = local_58._M_left;
  do {
    local_80._0_4_ = ZEXT14(::block_size_wide[lVar15]);
    local_80._4_4_ = ZEXT14(::block_size_high[lVar15]);
    __x = (_Link_type)local_80;
    std::
    set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
    ::insert((set<(anonymous_namespace)::BlockSize,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
              *)(local_80 + 0x20),(value_type *)local_80);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x16);
  __src = (pointer)0x0;
  pTVar12 = (pointer)0x0;
  pTVar14 = (pointer)0x0;
  pTVar16 = (pointer)0x0;
  pTVar6 = (pointer)0x0;
  p_Var8 = (_Base_ptr)0x0;
  do {
    local_80._16_8_ = p_Var8;
    if (local_58._M_left != &local_58) {
      iVar1 = *(int *)((long)&p_Var8->_M_right + (long)local_80);
      p_Var8 = local_58._M_left;
      do {
        BVar2.width_ = p_Var8[1]._M_color;
        BVar2.height_ = *(int *)&p_Var8[1].field_0x4;
        if (pTVar6 == pTVar16) {
          lVar15 = (long)pTVar16 - (long)pTVar14;
          if (lVar15 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar7 = (lVar15 >> 3) * -0x5555555555555555;
          uVar10 = uVar7;
          if (pTVar16 == pTVar14) {
            uVar10 = 1;
          }
          p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                     *)(uVar10 + uVar7);
          if ((_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
               *)0x555555555555554 < p_Var13) {
            p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                       *)0x555555555555555;
          }
          if (CARRY8(uVar10,uVar7)) {
            p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                       *)0x555555555555555;
          }
          __src = std::
                  _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                  ::_M_allocate(p_Var13,(size_t)__x);
          *(BlockSize *)((long)__src + lVar15) = BVar2;
          *(int *)((long)__src + lVar15 + 8) = iVar1;
          *(_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
            **)((long)__src + lVar15 + 0x10) = test_func;
          pTVar6 = __src;
          for (pTVar12 = pTVar14; pTVar16 != pTVar12; pTVar12 = pTVar12 + 1) {
            pTVar6->test_func_ = pTVar12->test_func_;
            iVar3 = pTVar12->bd_;
            uVar4 = *(undefined4 *)&pTVar12->field_0xc;
            pTVar6->block_ = pTVar12->block_;
            pTVar6->bd_ = iVar3;
            *(undefined4 *)&pTVar6->field_0xc = uVar4;
            pTVar6 = pTVar6 + 1;
          }
          if (pTVar14 != (pointer)0x0) {
            operator_delete(pTVar14);
          }
          pTVar16 = __src + (long)p_Var13;
          pTVar14 = __src;
        }
        else {
          pTVar6->block_ = BVar2;
          pTVar6->bd_ = iVar1;
          pTVar6->test_func_ = test_func;
        }
        pTVar6 = pTVar6 + 1;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        pTVar12 = pTVar6;
      } while (p_Var8 != &local_58);
    }
    p_Var8 = (_Base_ptr)(local_80._16_8_ + 4);
  } while (p_Var8 != (_Base_ptr)&DAT_00000008);
  std::
  _Rb_tree<(anonymous_namespace)::BlockSize,_(anonymous_namespace)::BlockSize,_std::_Identity<(anonymous_namespace)::BlockSize>,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
  ::_M_erase((_Rb_tree<(anonymous_namespace)::BlockSize,_(anonymous_namespace)::BlockSize,_std::_Identity<(anonymous_namespace)::BlockSize>,_std::less<(anonymous_namespace)::BlockSize>,_std::allocator<(anonymous_namespace)::BlockSize>_>
              *)local_58._M_parent,__x);
  p_Var8 = (_Base_ptr)operator_new(0x20);
  *(undefined ***)p_Var8 = &PTR__ValuesInIteratorRangeGenerator_0104e3d8;
  p_Var8->_M_parent = (_Base_ptr)0x0;
  p_Var8->_M_left = (_Base_ptr)0x0;
  p_Var8->_M_right = (_Base_ptr)0x0;
  lVar15 = (long)pTVar12 - (long)__src;
  p_Var13 = (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
             *)((lVar15 >> 3) * -0x5555555555555555);
  if (p_Var13 < (_Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
                 *)0x555555555555556) {
    p_Var9 = (_Base_ptr)
             std::
             _Vector_base<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
             ::_M_allocate(p_Var13,(size_t)__x);
    p_Var8->_M_parent = p_Var9;
    p_Var8->_M_right = (_Base_ptr)((long)p_Var9 + lVar15);
    if (__src != pTVar12) {
      uVar10 = (lVar15 - 0x18U) / 0x18;
      memcpy(p_Var9,__src,uVar10 * 0x18 + 0x18);
      p_Var9 = (_Base_ptr)(&p_Var9->_M_right + uVar10 * 3);
    }
    uVar5 = local_80._8_8_;
    p_Var8->_M_left = p_Var9;
    *(_Base_ptr *)local_80._8_8_ = p_Var8;
    *(_Base_ptr *)(local_80._8_8_ + 8) = (_Base_ptr)0x0;
    p_Var9 = (_Base_ptr)operator_new(0x18);
    p_Var9->_M_parent = (_Base_ptr)0x100000001;
    *(undefined ***)&p_Var9->_M_color = &PTR___Sp_counted_base_0104e4a0;
    p_Var9->_M_left = p_Var8;
    *(_Base_ptr *)(uVar5 + 8) = p_Var9;
    _Var11._M_pi = extraout_RDX;
    if (__src != (pointer)0x0) {
      operator_delete(__src);
      p_Var9 = extraout_RAX;
      _Var11._M_pi = extraout_RDX_00;
    }
    PVar17.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var11._M_pi;
    PVar17.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)p_Var9;
    return (ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
            )PVar17.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

::testing::internal::ParamGenerator<TestParam<T>> BuildHighbdLumaParams(
    T test_func) {
  return ::testing::ValuesIn(GetHighbdLumaTestParams(test_func));
}